

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# joiner_session.cpp
# Opt level: O0

void __thiscall ot::commissioner::JoinerSession::HandleConnect(JoinerSession *this,Error *aError)

{
  CommissionerHandler *pCVar1;
  Error local_40;
  Error *local_18;
  Error *aError_local;
  JoinerSession *this_local;
  
  pCVar1 = this->mCommImpl->mCommissionerHandler;
  local_18 = aError;
  aError_local = (Error *)this;
  Error::Error(&local_40,aError);
  (*pCVar1->_vptr_CommissionerHandler[1])(pCVar1,&this->mJoinerId,&local_40);
  Error::~Error(&local_40);
  return;
}

Assistant:

void JoinerSession::HandleConnect(Error aError)
{
    mCommImpl.mCommissionerHandler.OnJoinerConnected(mJoinerId, aError);
}